

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrCreateSwapchain(XrSession session,XrSwapchainCreateInfo *createInfo,
                          XrSwapchain *swapchain)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrSwapchain *swapchain_local;
  XrSwapchainCreateInfo *createInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)swapchain;
  swapchain_local = (XrSwapchain *)createInfo;
  createInfo_local = (XrSwapchainCreateInfo *)session;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrCreateSwapchain");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->CreateSwapchain)
                         ((XrSession)createInfo_local,(XrSwapchainCreateInfo *)swapchain_local,
                          (XrSwapchain *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrCreateSwapchain(
    XrSession                                   session,
    const XrSwapchainCreateInfo*                createInfo,
    XrSwapchain*                                swapchain) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrCreateSwapchain");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->CreateSwapchain(session, createInfo, swapchain);
    }
    return result;
}